

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_const_impl.h
# Opt level: O0

void secp256k1_ecmult_const(secp256k1_gej *r,secp256k1_ge *a,secp256k1_scalar *q)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  secp256k1_fe neg_y_1;
  uint index_1;
  uint negative_1;
  uint m_1;
  secp256k1_fe neg_y;
  uint index;
  uint negative;
  uint m;
  int j;
  secp256k1_ge t;
  uint bits2;
  uint bits1;
  int i;
  int group;
  secp256k1_fe global_z;
  secp256k1_ge pre_a_lam [16];
  secp256k1_ge pre_a [16];
  secp256k1_scalar v2;
  secp256k1_scalar v1;
  secp256k1_scalar s;
  secp256k1_ge *in_stack_fffffffffffff388;
  secp256k1_gej *in_stack_fffffffffffff390;
  secp256k1_scalar *in_stack_fffffffffffff398;
  secp256k1_scalar *in_stack_fffffffffffff3a0;
  undefined4 in_stack_fffffffffffff3b0;
  undefined4 in_stack_fffffffffffff3b4;
  undefined4 in_stack_fffffffffffff3b8;
  undefined4 in_stack_fffffffffffff3bc;
  uint uVar4;
  secp256k1_scalar *in_stack_fffffffffffff3c0;
  secp256k1_scalar *in_stack_fffffffffffff3c8;
  secp256k1_scalar *in_stack_fffffffffffff3d0;
  uint local_c10;
  int local_c0c;
  secp256k1_gej *in_stack_fffffffffffff3f8;
  secp256k1_gej *in_stack_fffffffffffff400;
  secp256k1_fe sStack_be0;
  undefined4 local_bb8;
  uint32_t local_bb0;
  uint local_bac;
  int local_ba8;
  int local_ba4;
  secp256k1_fe local_b78;
  secp256k1_fe asStack_b50 [5];
  secp256k1_ge *in_stack_fffffffffffff590;
  secp256k1_gej *in_stack_fffffffffffff598;
  secp256k1_gej *in_stack_fffffffffffff5a0;
  secp256k1_gej *in_stack_fffffffffffff600;
  secp256k1_fe *in_stack_fffffffffffff608;
  secp256k1_ge *in_stack_fffffffffffff610;
  secp256k1_fe local_5f8 [38];
  
  iVar1 = secp256k1_ge_is_infinity((secp256k1_ge *)0x96241c);
  if (iVar1 == 0) {
    secp256k1_scalar_add
              (in_stack_fffffffffffff3c0,
               (secp256k1_scalar *)CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8),
               (secp256k1_scalar *)CONCAT44(in_stack_fffffffffffff3b4,in_stack_fffffffffffff3b0));
    secp256k1_scalar_half(in_stack_fffffffffffff3a0,in_stack_fffffffffffff398);
    secp256k1_scalar_split_lambda
              (in_stack_fffffffffffff3d0,in_stack_fffffffffffff3c8,in_stack_fffffffffffff3c0);
    secp256k1_scalar_add
              (in_stack_fffffffffffff3c0,
               (secp256k1_scalar *)CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8),
               (secp256k1_scalar *)CONCAT44(in_stack_fffffffffffff3b4,in_stack_fffffffffffff3b0));
    secp256k1_scalar_add
              (in_stack_fffffffffffff3c0,
               (secp256k1_scalar *)CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8),
               (secp256k1_scalar *)CONCAT44(in_stack_fffffffffffff3b4,in_stack_fffffffffffff3b0));
    secp256k1_gej_set_ge(in_stack_fffffffffffff390,in_stack_fffffffffffff388);
    secp256k1_ecmult_const_odd_multiples_table_globalz
              (in_stack_fffffffffffff610,in_stack_fffffffffffff608,in_stack_fffffffffffff600);
    for (local_ba8 = 0; local_ba8 < 0x10; local_ba8 = local_ba8 + 1) {
      secp256k1_ge_mul_lambda((secp256k1_ge *)in_stack_fffffffffffff390,in_stack_fffffffffffff388);
    }
    for (local_ba4 = 0x19; -1 < local_ba4; local_ba4 = local_ba4 + -1) {
      local_bac = secp256k1_scalar_get_bits_var
                            ((secp256k1_scalar *)in_stack_fffffffffffff388,0,0x96256e);
      local_bb0 = secp256k1_scalar_get_bits_var
                            ((secp256k1_scalar *)in_stack_fffffffffffff388,0,0x96258f);
      uVar2 = local_bac >> 4 ^ 1;
      uVar3 = (-uVar2 ^ local_bac) & 0xf;
      memcpy(&stack0xfffffffffffff3f8,local_5f8,0x28);
      memcpy(&sStack_be0,local_5f8 + 1,0x28);
      for (local_c10 = 1; local_c10 < 0x10; local_c10 = local_c10 + 1) {
        secp256k1_fe_impl_cmov
                  ((secp256k1_fe *)&stack0xfffffffffffff3f8,
                   (secp256k1_fe *)((long)local_5f8 + (ulong)local_c10 * 0x58),
                   (uint)(local_c10 == uVar3));
        secp256k1_fe_impl_cmov
                  (&sStack_be0,(secp256k1_fe *)((long)local_5f8 + (ulong)local_c10 * 0x58 + 0x28),
                   (uint)(local_c10 == uVar3));
      }
      local_bb8 = 0;
      secp256k1_fe_impl_negate_unchecked((secp256k1_fe *)&stack0xfffffffffffff3c0,&sStack_be0,1);
      secp256k1_fe_impl_cmov(&sStack_be0,(secp256k1_fe *)&stack0xfffffffffffff3c0,uVar2);
      if (local_ba4 == 0x19) {
        secp256k1_gej_set_ge(in_stack_fffffffffffff390,in_stack_fffffffffffff388);
      }
      else {
        for (local_c0c = 0; local_c0c < 5; local_c0c = local_c0c + 1) {
          secp256k1_gej_double(in_stack_fffffffffffff400,in_stack_fffffffffffff3f8);
        }
        secp256k1_gej_add_ge
                  (in_stack_fffffffffffff5a0,in_stack_fffffffffffff598,in_stack_fffffffffffff590);
      }
      uVar4 = 0;
      uVar2 = local_bb0 >> 4 ^ 1;
      uVar3 = (-uVar2 ^ local_bb0) & 0xf;
      memcpy(&stack0xfffffffffffff3f8,&local_b78,0x28);
      memcpy(&sStack_be0,(void *)((long)asStack_b50 + (ulong)uVar4 * 0x58),0x28);
      for (uVar4 = 1; uVar4 < 0x10; uVar4 = uVar4 + 1) {
        secp256k1_fe_impl_cmov
                  ((secp256k1_fe *)&stack0xfffffffffffff3f8,
                   (secp256k1_fe *)((long)&local_b78 + (ulong)uVar4 * 0x58),(uint)(uVar4 == uVar3));
        secp256k1_fe_impl_cmov
                  (&sStack_be0,(secp256k1_fe *)((long)asStack_b50 + (ulong)uVar4 * 0x58),
                   (uint)(uVar4 == uVar3));
      }
      local_bb8 = 0;
      secp256k1_fe_impl_negate_unchecked((secp256k1_fe *)&stack0xfffffffffffff388,&sStack_be0,1);
      secp256k1_fe_impl_cmov(&sStack_be0,(secp256k1_fe *)&stack0xfffffffffffff388,uVar2);
      secp256k1_gej_add_ge
                (in_stack_fffffffffffff5a0,in_stack_fffffffffffff598,in_stack_fffffffffffff590);
    }
    secp256k1_fe_impl_mul
              (&in_stack_fffffffffffff390->x,&in_stack_fffffffffffff388->x,(secp256k1_fe *)0x9628be)
    ;
  }
  else {
    secp256k1_gej_set_infinity((secp256k1_gej *)0x96242e);
  }
  return;
}

Assistant:

static void secp256k1_ecmult_const(secp256k1_gej *r, const secp256k1_ge *a, const secp256k1_scalar *q) {
    /* The approach below combines the signed-digit logic from Mike Hamburg's
     * "Fast and compact elliptic-curve cryptography" (https://eprint.iacr.org/2012/309)
     * Section 3.3, with the GLV endomorphism.
     *
     * The idea there is to interpret the bits of a scalar as signs (1 = +, 0 = -), and compute a
     * point multiplication in that fashion. Let v be an n-bit non-negative integer (0 <= v < 2^n),
     * and v[i] its i'th bit (so v = sum(v[i] * 2^i, i=0..n-1)). Then define:
     *
     *   C_l(v, A) = sum((2*v[i] - 1) * 2^i*A, i=0..l-1)
     *
     * Then it holds that C_l(v, A) = sum((2*v[i] - 1) * 2^i*A, i=0..l-1)
     *                              = (2*sum(v[i] * 2^i, i=0..l-1) + 1 - 2^l) * A
     *                              = (2*v + 1 - 2^l) * A
     *
     * Thus, one can compute q*A as C_256((q + 2^256 - 1) / 2, A). This is the basis for the
     * paper's signed-digit multi-comb algorithm for multiplication using a precomputed table.
     *
     * It is appealing to try to combine this with the GLV optimization: the idea that a scalar
     * s can be written as s1 + lambda*s2, where lambda is a curve-specific constant such that
     * lambda*A is easy to compute, and where s1 and s2 are small. In particular we have the
     * secp256k1_scalar_split_lambda function which performs such a split with the resulting s1
     * and s2 in range (-2^128, 2^128) mod n. This does work, but is uninteresting:
     *
     *   To compute q*A:
     *   - Let s1, s2 = split_lambda(q)
     *   - Let R1 = C_256((s1 + 2^256 - 1) / 2, A)
     *   - Let R2 = C_256((s2 + 2^256 - 1) / 2, lambda*A)
     *   - Return R1 + R2
     *
     * The issue is that while s1 and s2 are small-range numbers, (s1 + 2^256 - 1) / 2 (mod n)
     * and (s2 + 2^256 - 1) / 2 (mod n) are not, undoing the benefit of the splitting.
     *
     * To make it work, we want to modify the input scalar q first, before splitting, and then only
     * add a 2^128 offset of the split results (so that they end up in the single 129-bit range
     * [0,2^129]). A slightly smaller offset would work due to the bounds on the split, but we pick
     * 2^128 for simplicity. Let s be the scalar fed to split_lambda, and f(q) the function to
     * compute it from q:
     *
     *   To compute q*A:
     *   - Compute s = f(q)
     *   - Let s1, s2 = split_lambda(s)
     *   - Let v1 = s1 + 2^128 (mod n)
     *   - Let v2 = s2 + 2^128 (mod n)
     *   - Let R1 = C_l(v1, A)
     *   - Let R2 = C_l(v2, lambda*A)
     *   - Return R1 + R2
     *
     * l will thus need to be at least 129, but we may overshoot by a few bits (see
     * further), so keep it as a variable.
     *
     * To solve for s, we reason:
     *     q*A  = R1 + R2
     * <=> q*A  = C_l(s1 + 2^128, A) + C_l(s2 + 2^128, lambda*A)
     * <=> q*A  = (2*(s1 + 2^128) + 1 - 2^l) * A + (2*(s2 + 2^128) + 1 - 2^l) * lambda*A
     * <=> q*A  = (2*(s1 + s2*lambda) + (2^129 + 1 - 2^l) * (1 + lambda)) * A
     * <=> q    = 2*(s1 + s2*lambda) + (2^129 + 1 - 2^l) * (1 + lambda) (mod n)
     * <=> q    = 2*s + (2^129 + 1 - 2^l) * (1 + lambda) (mod n)
     * <=> s    = (q + (2^l - 2^129 - 1) * (1 + lambda)) / 2 (mod n)
     * <=> f(q) = (q + K) / 2 (mod n)
     *            where K = (2^l - 2^129 - 1)*(1 + lambda) (mod n)
     *
     * We will process the computation of C_l(v1, A) and C_l(v2, lambda*A) in groups of
     * ECMULT_CONST_GROUP_SIZE, so we set l to the smallest multiple of ECMULT_CONST_GROUP_SIZE
     * that is not less than 129; this equals ECMULT_CONST_BITS.
     */

    /* The offset to add to s1 and s2 to make them non-negative. Equal to 2^128. */
    static const secp256k1_scalar S_OFFSET = SECP256K1_SCALAR_CONST(0, 0, 0, 1, 0, 0, 0, 0);
    secp256k1_scalar s, v1, v2;
    secp256k1_ge pre_a[ECMULT_CONST_TABLE_SIZE];
    secp256k1_ge pre_a_lam[ECMULT_CONST_TABLE_SIZE];
    secp256k1_fe global_z;
    int group, i;

    /* We're allowed to be non-constant time in the point, and the code below (in particular,
     * secp256k1_ecmult_const_odd_multiples_table_globalz) cannot deal with infinity in a
     * constant-time manner anyway. */
    if (secp256k1_ge_is_infinity(a)) {
        secp256k1_gej_set_infinity(r);
        return;
    }

    /* Compute v1 and v2. */
    secp256k1_scalar_add(&s, q, &secp256k1_ecmult_const_K);
    secp256k1_scalar_half(&s, &s);
    secp256k1_scalar_split_lambda(&v1, &v2, &s);
    secp256k1_scalar_add(&v1, &v1, &S_OFFSET);
    secp256k1_scalar_add(&v2, &v2, &S_OFFSET);

#ifdef VERIFY
    /* Verify that v1 and v2 are in range [0, 2^129-1]. */
    for (i = 129; i < 256; ++i) {
        VERIFY_CHECK(secp256k1_scalar_get_bits_limb32(&v1, i, 1) == 0);
        VERIFY_CHECK(secp256k1_scalar_get_bits_limb32(&v2, i, 1) == 0);
    }
#endif

    /* Calculate odd multiples of A and A*lambda.
     * All multiples are brought to the same Z 'denominator', which is stored
     * in global_z. Due to secp256k1' isomorphism we can do all operations pretending
     * that the Z coordinate was 1, use affine addition formulae, and correct
     * the Z coordinate of the result once at the end.
     */
    secp256k1_gej_set_ge(r, a);
    secp256k1_ecmult_const_odd_multiples_table_globalz(pre_a, &global_z, r);
    for (i = 0; i < ECMULT_CONST_TABLE_SIZE; i++) {
        secp256k1_ge_mul_lambda(&pre_a_lam[i], &pre_a[i]);
    }

    /* Next, we compute r = C_l(v1, A) + C_l(v2, lambda*A).
     *
     * We proceed in groups of ECMULT_CONST_GROUP_SIZE bits, operating on that many bits
     * at a time, from high in v1, v2 to low. Call these bits1 (from v1) and bits2 (from v2).
     *
     * Now note that ECMULT_CONST_TABLE_GET_GE(&t, pre_a, bits1) loads into t a point equal
     * to C_{ECMULT_CONST_GROUP_SIZE}(bits1, A), and analogously for pre_lam_a / bits2.
     * This means that all we need to do is add these looked up values together, multiplied
     * by 2^(ECMULT_GROUP_SIZE * group).
     */
    for (group = ECMULT_CONST_GROUPS - 1; group >= 0; --group) {
        /* Using the _var get_bits function is ok here, since it's only variable in offset and count, not in the scalar. */
        unsigned int bits1 = secp256k1_scalar_get_bits_var(&v1, group * ECMULT_CONST_GROUP_SIZE, ECMULT_CONST_GROUP_SIZE);
        unsigned int bits2 = secp256k1_scalar_get_bits_var(&v2, group * ECMULT_CONST_GROUP_SIZE, ECMULT_CONST_GROUP_SIZE);
        secp256k1_ge t;
        int j;

        ECMULT_CONST_TABLE_GET_GE(&t, pre_a, bits1);
        if (group == ECMULT_CONST_GROUPS - 1) {
            /* Directly set r in the first iteration. */
            secp256k1_gej_set_ge(r, &t);
        } else {
            /* Shift the result so far up. */
            for (j = 0; j < ECMULT_CONST_GROUP_SIZE; ++j) {
                secp256k1_gej_double(r, r);
            }
            secp256k1_gej_add_ge(r, r, &t);
        }
        ECMULT_CONST_TABLE_GET_GE(&t, pre_a_lam, bits2);
        secp256k1_gej_add_ge(r, r, &t);
    }

    /* Map the result back to the secp256k1 curve from the isomorphic curve. */
    secp256k1_fe_mul(&r->z, &r->z, &global_z);
}